

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall pstore::command_line::literal::literal(literal *this,string *n,int v,string *d)

{
  string *d_local;
  int v_local;
  string *n_local;
  literal *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)n);
  this->value = v;
  std::__cxx11::string::string((string *)&this->description,(string *)d);
  return;
}

Assistant:

literal (std::string const & n, int const v, std::string const & d)
                    : name{n}
                    , value{v}
                    , description{d} {}